

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop.c
# Opt level: O0

wheelchair_boarding_t parse_wheelchair_boarding(char *value)

{
  int iVar1;
  char *value_local;
  
  iVar1 = strcmp(value,"0");
  if ((iVar1 == 0) || (iVar1 = strcmp(value,""), iVar1 == 0)) {
    return WB_UNKNOWN_OR_INHERITED;
  }
  iVar1 = strcmp(value,"1");
  if (iVar1 == 0) {
    return WB_SOME;
  }
  iVar1 = strcmp(value,"2");
  if (iVar1 == 0) {
    return WB_NOT_POSSIBLE;
  }
  return WB_NOT_SET;
}

Assistant:

wheelchair_boarding_t parse_wheelchair_boarding(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return WB_UNKNOWN_OR_INHERITED;
    else if (strcmp(value, "1") == 0)
        return WB_SOME;
    else if (strcmp(value, "2") == 0)
        return WB_NOT_POSSIBLE;
    else
        return WB_NOT_SET;
}